

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O1

bov_points_t * bov_points_new(GLfloat (*coords) [2],GLsizei n,GLenum usage)

{
  int iVar1;
  bov_points_t *pbVar2;
  GLsizei GVar3;
  int extraout_EDX;
  undefined4 in_register_00000034;
  void *pvVar4;
  bov_points_t *pbVar5;
  
  pvVar4 = (void *)CONCAT44(in_register_00000034,n);
  pbVar5 = (bov_points_t *)0x50;
  pbVar2 = (bov_points_t *)malloc(0x50);
  if (pbVar2 != (bov_points_t *)0x0) {
    GVar3 = n;
    if (coords == (GLfloat (*) [2])0x0) {
      GVar3 = 0;
    }
    pbVar2->vboLen = GVar3;
    (pbVar2->param).fillColor[0] = 0.0;
    (pbVar2->param).fillColor[1] = 0.0;
    (pbVar2->param).fillColor[2] = 0.0;
    (pbVar2->param).fillColor[3] = 1.0;
    (pbVar2->param).outlineColor[0] = 1.0;
    (pbVar2->param).outlineColor[1] = 1.0;
    (pbVar2->param).outlineColor[2] = 1.0;
    (pbVar2->param).outlineColor[3] = 1.0;
    (pbVar2->param).pos[0] = 0.0;
    (pbVar2->param).pos[1] = 0.0;
    (pbVar2->param).scale[0] = 1.0;
    (pbVar2->param).scale[1] = 1.0;
    (pbVar2->param).width = 0.025;
    (pbVar2->param).marker = 0.0;
    (pbVar2->param).outlineWidth = -1.0;
    (pbVar2->param).spaceType = USUAL_SPACE;
    (*glad_glGenVertexArrays)(1,(GLuint *)pbVar2);
    (*glad_glBindVertexArray)(pbVar2->vao);
    (*glad_glGenBuffers)(1,&pbVar2->vbo);
    (*glad_glBindBuffer)(0x8892,pbVar2->vbo);
    (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0,(void *)0x0);
    (*glad_glEnableVertexAttribArray)(0);
    (*glad_glBufferData)(0x8892,(long)n * 8,coords,usage);
    pbVar2->vboCapacity = n;
    return pbVar2;
  }
  bov_points_new_cold_1();
  iVar1 = 0;
  if (pvVar4 != (void *)0x0) {
    iVar1 = extraout_EDX;
  }
  pbVar5->vboLen = iVar1;
  (*glad_glBindBuffer)(0x8892,pbVar5->vbo);
  if (pbVar5->vboCapacity < extraout_EDX) {
    (*glad_glBufferData)(0x8892,(long)extraout_EDX << 3,pvVar4,0x88e8);
    pbVar5->vboCapacity = extraout_EDX;
  }
  else if (pvVar4 != (void *)0x0) {
    (*glad_glBufferSubData)(0x8892,0,(long)extraout_EDX << 3,pvVar4);
  }
  return pbVar5;
}

Assistant:

bov_points_t* bov_points_new(const GLfloat coords[][2],
                             GLsizei n,
                             GLenum usage)
{
	bov_points_t* points = malloc(sizeof(bov_points_t));
	CHECK_MALLOC(points);

	points->vboLen = coords==NULL ? 0 : n;

	points->param = (bov_points_param_t) {
		.fillColor = {0.0f, 0.0f, 0.0f, 1.0f}, // color
		.outlineColor = {1.0f ,1.0f, 1.0f, 1.0f}, // outlineColor
		.pos = {0.0f ,0.0f},           // other
		.scale = {1.0f, 1.0f},           // localPos
		.width = 0.025f,
		.marker = 0.0f,
		.outlineWidth = -1.0f,
		.spaceType = USUAL_SPACE
	};

	// Create Vertex Array Object
	glGenVertexArrays(1, &points->vao);
	glBindVertexArray(points->vao);

	// Vertex Buffer Object
	glGenBuffers(1, &points->vbo);
	glBindBuffer(GL_ARRAY_BUFFER, points->vbo);

	// specify the layout of the data
	glVertexAttribPointer(POS_LOCATION, 2, GL_FLOAT, GL_FALSE, 0, 0);
	glEnableVertexAttribArray(POS_LOCATION);

	glBufferData(GL_ARRAY_BUFFER, sizeof(GLfloat) * 2 * n, coords, usage);
	points->vboCapacity = n;

	// glBindBuffer(GL_ARRAY_BUFFER, 0);
	// glBindVertexArray(0);

	return points;
}